

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O3

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::Instance,_embree::InstancePrimitive>::leafBounds
          (BBox3fa *__return_storage_ptr__,
          BVHNRefitT<4,_embree::Instance,_embree::InstancePrimitive> *this,NodeRef *ref)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  Instance *pIVar2;
  AffineSpace3ff *pAVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  BBox3fa *bounds;
  float fVar27;
  float fVar30;
  float fVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar54;
  float fVar55;
  undefined1 auVar51 [16];
  float fVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float local_38;
  float local_18;
  float fStack_14;
  
  if (ref->ptr == 8) {
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
    return __return_storage_ptr__;
  }
  lVar26 = (ulong)((uint)ref->ptr & 0xf) - 8;
  aVar32 = _DAT_01f7a9f0;
  aVar33 = _DAT_01f7aa00;
  if (lVar26 != 0) {
    pIVar2 = this->mesh;
    pAVar3 = pIVar2->local2world;
    do {
      if ((pIVar2->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar27 = (pAVar3->p).field_0.m128[3];
        fVar30 = (pAVar3->l).vx.field_0.m128[3];
        fVar31 = (pAVar3->l).vy.field_0.m128[3];
        fVar38 = (pAVar3->l).vz.field_0.m128[3];
        aVar1 = (pAVar3->l).vx.field_0.field_1;
        fVar66 = (pAVar3->l).vy.field_0.m128[0];
        fVar68 = (pAVar3->l).vy.field_0.m128[1];
        fVar44 = fVar30 * fVar31 + fVar27 * fVar38;
        fVar37 = fVar30 * fVar31 - fVar27 * fVar38;
        fVar46 = fVar27 * fVar27 + fVar30 * fVar30 + -fVar31 * fVar31 + -fVar38 * fVar38;
        fVar70 = fVar27 * fVar27 - fVar30 * fVar30;
        fVar48 = fVar31 * fVar31 + fVar70 + -fVar38 * fVar38;
        fVar34 = fVar30 * fVar38 - fVar27 * fVar31;
        fVar42 = fVar27 * fVar31 + fVar30 * fVar38;
        fVar39 = fVar31 * fVar38 + fVar27 * fVar30;
        fVar65 = fVar31 * fVar38 - fVar27 * fVar30;
        fVar36 = fVar38 * fVar38 + fVar70 + -fVar31 * fVar31;
        fVar27 = (pAVar3->l).vz.field_0.m128[0];
        fVar30 = (pAVar3->l).vz.field_0.m128[1];
        fVar31 = (pAVar3->l).vz.field_0.m128[2];
        fVar44 = fVar44 + fVar44;
        fVar34 = fVar34 + fVar34;
        fVar38 = (pAVar3->p).field_0.m128[0];
        fVar70 = (pAVar3->p).field_0.m128[1];
        fVar35 = (pAVar3->p).field_0.m128[2];
        fVar37 = fVar37 + fVar37;
        fVar39 = fVar39 + fVar39;
        fVar42 = fVar42 + fVar42;
        fVar65 = fVar65 + fVar65;
        fVar67 = fVar46 * 1.0 + fVar44 * 0.0 + fVar34 * 0.0;
        fVar69 = fVar46 * 0.0 + fVar44 * 1.0 + fVar34 * 0.0;
        fVar40 = fVar46 * 0.0 + fVar44 * 0.0 + fVar34 * 1.0;
        fVar41 = fVar46 * 0.0 + fVar44 * 0.0 + fVar34 * 0.0;
        fVar44 = fVar37 * 1.0 + fVar48 * 0.0 + fVar39 * 0.0;
        fVar46 = fVar37 * 0.0 + fVar48 * 1.0 + fVar39 * 0.0;
        fVar47 = fVar37 * 0.0 + fVar48 * 0.0 + fVar39 * 1.0;
        fVar48 = fVar37 * 0.0 + fVar48 * 0.0 + fVar39 * 0.0;
        fVar54 = fVar42 * 1.0 + fVar65 * 0.0 + fVar36 * 0.0;
        fVar55 = fVar42 * 0.0 + fVar65 * 1.0 + fVar36 * 0.0;
        fVar56 = fVar42 * 0.0 + fVar65 * 0.0 + fVar36 * 1.0;
        fVar65 = fVar42 * 0.0 + fVar65 * 0.0 + fVar36 * 0.0;
        local_38 = aVar1.x;
        fVar34 = local_38 * fVar67 + fVar44 * 0.0 + fVar54 * 0.0;
        fVar36 = local_38 * fVar69 + fVar46 * 0.0 + fVar55 * 0.0;
        fVar37 = local_38 * fVar40 + fVar47 * 0.0 + fVar56 * 0.0;
        fVar39 = local_38 * fVar41 + fVar48 * 0.0 + fVar65 * 0.0;
        local_18 = aVar1.y;
        fStack_14 = aVar1.z;
        fVar43 = fVar66 * fVar67 + fVar68 * fVar44 + fVar54 * 0.0;
        fVar50 = fVar66 * fVar69 + fVar68 * fVar46 + fVar55 * 0.0;
        fVar60 = fVar66 * fVar40 + fVar68 * fVar47 + fVar56 * 0.0;
        fVar63 = fVar66 * fVar41 + fVar68 * fVar48 + fVar65 * 0.0;
        fVar64 = fVar27 * fVar67 + fVar30 * fVar44 + fVar31 * fVar54;
        fVar72 = fVar27 * fVar69 + fVar30 * fVar46 + fVar31 * fVar55;
        fVar71 = fVar27 * fVar40 + fVar30 * fVar47 + fVar31 * fVar56;
        fVar73 = fVar27 * fVar41 + fVar30 * fVar48 + fVar31 * fVar65;
        fVar30 = fVar38 * fVar67 + fVar70 * fVar44 + fVar35 * fVar54 + local_18 + 0.0;
        fVar66 = fVar38 * fVar69 + fVar70 * fVar46 + fVar35 * fVar55 + fStack_14 + 0.0;
        fVar68 = fVar38 * fVar40 + fVar70 * fVar47 + fVar35 * fVar56 +
                 (pAVar3->l).vy.field_0.m128[2] + 0.0;
        fVar35 = fVar38 * fVar41 + fVar70 * fVar48 + fVar35 * fVar65 + 0.0;
        lVar4 = *(long *)&(pIVar2->super_Geometry).field_0x58;
        auVar28 = minps(*(undefined1 (*) [16])(lVar4 + 0x10),*(undefined1 (*) [16])(lVar4 + 0x30));
        auVar49 = maxps(*(undefined1 (*) [16])(lVar4 + 0x20),*(undefined1 (*) [16])(lVar4 + 0x40));
        fVar48 = auVar28._0_4_;
        fVar55 = auVar28._4_4_;
        fVar27 = auVar28._8_4_;
        fVar54 = fVar27 * fVar64 + fVar30;
        fVar56 = fVar27 * fVar72 + fVar66;
        fVar57 = fVar27 * fVar71 + fVar68;
        fVar58 = fVar27 * fVar73 + fVar35;
        fVar59 = fVar55 * fVar43;
        fVar61 = fVar55 * fVar50;
        fVar62 = fVar55 * fVar60;
        fVar55 = fVar55 * fVar63;
        fVar65 = fVar59 + fVar54;
        fVar67 = fVar61 + fVar56;
        fVar69 = fVar62 + fVar57;
        fVar40 = fVar55 + fVar58;
        fVar44 = fVar48 * fVar34;
        fVar46 = fVar48 * fVar36;
        fVar47 = fVar48 * fVar37;
        fVar48 = fVar48 * fVar39;
        fVar27 = fVar44 + fVar65;
        fVar31 = fVar46 + fVar67;
        fVar38 = fVar47 + fVar69;
        fVar70 = fVar48 + fVar40;
        auVar28._4_4_ = fVar31;
        auVar28._0_4_ = fVar27;
        auVar28._8_4_ = fVar38;
        auVar28._12_4_ = fVar70;
        auVar28 = minps((undefined1  [16])_DAT_01f7a9f0,auVar28);
        auVar51._4_4_ = fVar31;
        auVar51._0_4_ = fVar27;
        auVar51._8_4_ = fVar38;
        auVar51._12_4_ = fVar70;
        auVar51 = maxps((undefined1  [16])_DAT_01f7aa00,auVar51);
        fVar41 = auVar49._0_4_;
        fVar42 = auVar49._4_4_;
        fVar27 = auVar49._8_4_;
        fVar30 = fVar27 * fVar64 + fVar30;
        fVar66 = fVar27 * fVar72 + fVar66;
        fVar68 = fVar27 * fVar71 + fVar68;
        fVar35 = fVar27 * fVar73 + fVar35;
        fVar59 = fVar59 + fVar30;
        fVar61 = fVar61 + fVar66;
        fVar62 = fVar62 + fVar68;
        fVar55 = fVar55 + fVar35;
        fVar27 = fVar44 + fVar59;
        fVar31 = fVar46 + fVar61;
        fVar38 = fVar47 + fVar62;
        fVar70 = fVar48 + fVar55;
        auVar14._4_4_ = fVar31;
        auVar14._0_4_ = fVar27;
        auVar14._8_4_ = fVar38;
        auVar14._12_4_ = fVar70;
        auVar28 = minps(auVar28,auVar14);
        auVar15._4_4_ = fVar31;
        auVar15._0_4_ = fVar27;
        auVar15._8_4_ = fVar38;
        auVar15._12_4_ = fVar70;
        auVar51 = maxps(auVar51,auVar15);
        fVar43 = fVar42 * fVar43;
        fVar50 = fVar42 * fVar50;
        fVar60 = fVar42 * fVar60;
        fVar42 = fVar42 * fVar63;
        fVar54 = fVar54 + fVar43;
        fVar56 = fVar56 + fVar50;
        fVar57 = fVar57 + fVar60;
        fVar58 = fVar58 + fVar42;
        fVar27 = fVar44 + fVar54;
        fVar31 = fVar46 + fVar56;
        fVar38 = fVar47 + fVar57;
        fVar70 = fVar48 + fVar58;
        auVar16._4_4_ = fVar31;
        auVar16._0_4_ = fVar27;
        auVar16._8_4_ = fVar38;
        auVar16._12_4_ = fVar70;
        auVar28 = minps(auVar28,auVar16);
        auVar17._4_4_ = fVar31;
        auVar17._0_4_ = fVar27;
        auVar17._8_4_ = fVar38;
        auVar17._12_4_ = fVar70;
        auVar51 = maxps(auVar51,auVar17);
        fVar43 = fVar43 + fVar30;
        fVar50 = fVar50 + fVar66;
        fVar60 = fVar60 + fVar68;
        fVar42 = fVar42 + fVar35;
        fVar44 = fVar44 + fVar43;
        fVar46 = fVar46 + fVar50;
        fVar47 = fVar47 + fVar60;
        fVar48 = fVar48 + fVar42;
        auVar49._4_4_ = fVar46;
        auVar49._0_4_ = fVar44;
        auVar49._8_4_ = fVar47;
        auVar49._12_4_ = fVar48;
        auVar28 = minps(auVar28,auVar49);
        auVar11._4_4_ = fVar46;
        auVar11._0_4_ = fVar44;
        auVar11._8_4_ = fVar47;
        auVar11._12_4_ = fVar48;
        auVar51 = maxps(auVar51,auVar11);
        fVar34 = fVar41 * fVar34;
        fVar36 = fVar41 * fVar36;
        fVar37 = fVar41 * fVar37;
        fVar41 = fVar41 * fVar39;
        fVar65 = fVar65 + fVar34;
        fVar67 = fVar67 + fVar36;
        fVar69 = fVar69 + fVar37;
        fVar40 = fVar40 + fVar41;
        auVar12._4_4_ = fVar67;
        auVar12._0_4_ = fVar65;
        auVar12._8_4_ = fVar69;
        auVar12._12_4_ = fVar40;
        auVar28 = minps(auVar28,auVar12);
        auVar13._4_4_ = fVar67;
        auVar13._0_4_ = fVar65;
        auVar13._8_4_ = fVar69;
        auVar13._12_4_ = fVar40;
        auVar51 = maxps(auVar51,auVar13);
        fVar59 = fVar59 + fVar34;
        fVar61 = fVar61 + fVar36;
        fVar62 = fVar62 + fVar37;
        fVar55 = fVar55 + fVar41;
        auVar20._4_4_ = fVar61;
        auVar20._0_4_ = fVar59;
        auVar20._8_4_ = fVar62;
        auVar20._12_4_ = fVar55;
        auVar28 = minps(auVar28,auVar20);
        auVar21._4_4_ = fVar61;
        auVar21._0_4_ = fVar59;
        auVar21._8_4_ = fVar62;
        auVar21._12_4_ = fVar55;
        auVar51 = maxps(auVar51,auVar21);
        auVar53._0_4_ = fVar54 + fVar34;
        auVar53._4_4_ = fVar56 + fVar36;
        auVar53._8_4_ = fVar57 + fVar37;
        auVar53._12_4_ = fVar58 + fVar41;
        auVar28 = minps(auVar28,auVar53);
        auVar51 = maxps(auVar51,auVar53);
        auVar45._0_4_ = fVar34 + fVar43;
        auVar45._4_4_ = fVar36 + fVar50;
        auVar45._8_4_ = fVar37 + fVar60;
        auVar45._12_4_ = fVar41 + fVar42;
        auVar28 = minps(auVar28,auVar45);
        auVar51 = maxps(auVar51,auVar45);
      }
      else {
        fVar27 = (pAVar3->l).vx.field_0.m128[0];
        fVar30 = (pAVar3->l).vx.field_0.m128[1];
        fVar31 = (pAVar3->l).vx.field_0.m128[2];
        fVar38 = (pAVar3->l).vx.field_0.m128[3];
        fVar66 = (pAVar3->l).vy.field_0.m128[0];
        fVar68 = (pAVar3->l).vy.field_0.m128[1];
        fVar70 = (pAVar3->l).vy.field_0.m128[2];
        fVar35 = (pAVar3->l).vy.field_0.m128[3];
        fVar34 = (pAVar3->l).vz.field_0.m128[0];
        fVar36 = (pAVar3->l).vz.field_0.m128[1];
        fVar37 = (pAVar3->l).vz.field_0.m128[2];
        fVar39 = (pAVar3->l).vz.field_0.m128[3];
        fVar44 = (pAVar3->p).field_0.m128[0];
        fVar46 = (pAVar3->p).field_0.m128[1];
        fVar47 = (pAVar3->p).field_0.m128[2];
        fVar48 = (pAVar3->p).field_0.m128[3];
        lVar4 = *(long *)&(pIVar2->super_Geometry).field_0x58;
        auVar51 = minps(*(undefined1 (*) [16])(lVar4 + 0x10),*(undefined1 (*) [16])(lVar4 + 0x30));
        auVar28 = maxps(*(undefined1 (*) [16])(lVar4 + 0x20),*(undefined1 (*) [16])(lVar4 + 0x40));
        fVar43 = auVar51._0_4_;
        fVar60 = auVar51._4_4_;
        fVar65 = auVar51._8_4_;
        fVar50 = fVar65 * fVar34 + fVar44;
        fVar54 = fVar65 * fVar36 + fVar46;
        fVar55 = fVar65 * fVar37 + fVar47;
        fVar56 = fVar65 * fVar39 + fVar48;
        fVar57 = fVar60 * fVar66;
        fVar58 = fVar60 * fVar68;
        fVar59 = fVar60 * fVar70;
        fVar60 = fVar60 * fVar35;
        fVar61 = fVar57 + fVar50;
        fVar62 = fVar58 + fVar54;
        fVar63 = fVar59 + fVar55;
        fVar64 = fVar60 + fVar56;
        fVar40 = fVar43 * fVar27;
        fVar41 = fVar43 * fVar30;
        fVar42 = fVar43 * fVar31;
        fVar43 = fVar43 * fVar38;
        fVar65 = fVar40 + fVar61;
        fVar67 = fVar41 + fVar62;
        fVar69 = fVar42 + fVar63;
        fVar72 = fVar43 + fVar64;
        auVar24._4_4_ = fVar67;
        auVar24._0_4_ = fVar65;
        auVar24._8_4_ = fVar69;
        auVar24._12_4_ = fVar72;
        auVar51 = minps((undefined1  [16])_DAT_01f7a9f0,auVar24);
        auVar25._4_4_ = fVar67;
        auVar25._0_4_ = fVar65;
        auVar25._8_4_ = fVar69;
        auVar25._12_4_ = fVar72;
        auVar49 = maxps((undefined1  [16])_DAT_01f7aa00,auVar25);
        fVar65 = auVar28._0_4_;
        fVar67 = auVar28._4_4_;
        fVar69 = auVar28._8_4_;
        fVar44 = fVar69 * fVar34 + fVar44;
        fVar46 = fVar69 * fVar36 + fVar46;
        fVar47 = fVar69 * fVar37 + fVar47;
        fVar48 = fVar69 * fVar39 + fVar48;
        fVar57 = fVar57 + fVar44;
        fVar58 = fVar58 + fVar46;
        fVar59 = fVar59 + fVar47;
        fVar60 = fVar60 + fVar48;
        fVar34 = fVar40 + fVar57;
        fVar36 = fVar41 + fVar58;
        fVar37 = fVar42 + fVar59;
        fVar39 = fVar43 + fVar60;
        auVar5._4_4_ = fVar36;
        auVar5._0_4_ = fVar34;
        auVar5._8_4_ = fVar37;
        auVar5._12_4_ = fVar39;
        auVar28 = minps(auVar51,auVar5);
        auVar6._4_4_ = fVar36;
        auVar6._0_4_ = fVar34;
        auVar6._8_4_ = fVar37;
        auVar6._12_4_ = fVar39;
        auVar51 = maxps(auVar49,auVar6);
        fVar66 = fVar67 * fVar66;
        fVar68 = fVar67 * fVar68;
        fVar70 = fVar67 * fVar70;
        fVar67 = fVar67 * fVar35;
        fVar50 = fVar50 + fVar66;
        fVar54 = fVar54 + fVar68;
        fVar55 = fVar55 + fVar70;
        fVar56 = fVar56 + fVar67;
        fVar35 = fVar40 + fVar50;
        fVar34 = fVar41 + fVar54;
        fVar36 = fVar42 + fVar55;
        fVar37 = fVar43 + fVar56;
        auVar7._4_4_ = fVar34;
        auVar7._0_4_ = fVar35;
        auVar7._8_4_ = fVar36;
        auVar7._12_4_ = fVar37;
        auVar28 = minps(auVar28,auVar7);
        auVar8._4_4_ = fVar34;
        auVar8._0_4_ = fVar35;
        auVar8._8_4_ = fVar36;
        auVar8._12_4_ = fVar37;
        auVar51 = maxps(auVar51,auVar8);
        fVar66 = fVar66 + fVar44;
        fVar68 = fVar68 + fVar46;
        fVar70 = fVar70 + fVar47;
        fVar67 = fVar67 + fVar48;
        fVar40 = fVar40 + fVar66;
        fVar41 = fVar41 + fVar68;
        fVar42 = fVar42 + fVar70;
        fVar43 = fVar43 + fVar67;
        auVar9._4_4_ = fVar41;
        auVar9._0_4_ = fVar40;
        auVar9._8_4_ = fVar42;
        auVar9._12_4_ = fVar43;
        auVar28 = minps(auVar28,auVar9);
        auVar10._4_4_ = fVar41;
        auVar10._0_4_ = fVar40;
        auVar10._8_4_ = fVar42;
        auVar10._12_4_ = fVar43;
        auVar51 = maxps(auVar51,auVar10);
        fVar27 = fVar65 * fVar27;
        fVar30 = fVar65 * fVar30;
        fVar31 = fVar65 * fVar31;
        fVar65 = fVar65 * fVar38;
        fVar61 = fVar61 + fVar27;
        fVar62 = fVar62 + fVar30;
        fVar63 = fVar63 + fVar31;
        fVar64 = fVar64 + fVar65;
        auVar22._4_4_ = fVar62;
        auVar22._0_4_ = fVar61;
        auVar22._8_4_ = fVar63;
        auVar22._12_4_ = fVar64;
        auVar28 = minps(auVar28,auVar22);
        auVar23._4_4_ = fVar62;
        auVar23._0_4_ = fVar61;
        auVar23._8_4_ = fVar63;
        auVar23._12_4_ = fVar64;
        auVar51 = maxps(auVar51,auVar23);
        fVar57 = fVar57 + fVar27;
        fVar58 = fVar58 + fVar30;
        fVar59 = fVar59 + fVar31;
        fVar60 = fVar60 + fVar65;
        auVar18._4_4_ = fVar58;
        auVar18._0_4_ = fVar57;
        auVar18._8_4_ = fVar59;
        auVar18._12_4_ = fVar60;
        auVar28 = minps(auVar28,auVar18);
        auVar19._4_4_ = fVar58;
        auVar19._0_4_ = fVar57;
        auVar19._8_4_ = fVar59;
        auVar19._12_4_ = fVar60;
        auVar51 = maxps(auVar51,auVar19);
        auVar52._0_4_ = fVar50 + fVar27;
        auVar52._4_4_ = fVar54 + fVar30;
        auVar52._8_4_ = fVar55 + fVar31;
        auVar52._12_4_ = fVar56 + fVar65;
        auVar28 = minps(auVar28,auVar52);
        auVar51 = maxps(auVar51,auVar52);
        auVar29._0_4_ = fVar27 + fVar66;
        auVar29._4_4_ = fVar30 + fVar68;
        auVar29._8_4_ = fVar31 + fVar70;
        auVar29._12_4_ = fVar65 + fVar67;
        auVar28 = minps(auVar28,auVar29);
        auVar51 = maxps(auVar51,auVar29);
      }
      aVar33.m128 = (__m128)maxps(aVar33.m128,auVar51);
      aVar32.m128 = (__m128)minps(aVar32.m128,auVar28);
      lVar26 = lVar26 + -1;
    } while (lVar26 != 0);
  }
  (__return_storage_ptr__->lower).field_0 = aVar32;
  (__return_storage_ptr__->upper).field_0 = aVar33;
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }